

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void s_split(string *s,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *tokens,char delim)

{
  pointer pcVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  anon_class_40_2_b75c6d7b string_find_first_not;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  char local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(tokens,(tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  local_78 = local_68;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar1,pcVar1 + s->_M_string_length)
  ;
  uVar3 = 0xffffffffffffffff;
  if (local_70 != 0) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (*(char *)((long)local_78 + uVar2) != delim) break;
      uVar2 = uVar2 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (local_70 != uVar2);
  }
  local_58 = delim;
  uVar2 = std::__cxx11::string::find((char)s,(ulong)(uint)(int)delim);
  if (uVar3 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = 0xffffffffffffffff;
      if (uVar2 < local_70) {
        do {
          uVar3 = uVar2;
          if (*(char *)((long)local_78 + uVar2) != local_58) break;
          uVar2 = uVar2 + 1;
          uVar3 = 0xffffffffffffffff;
        } while (local_70 != uVar2);
      }
      uVar2 = std::__cxx11::string::find((char)s,(ulong)(uint)(int)delim);
    } while (uVar3 != 0xffffffffffffffff);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void s_split(const string &s, vector<string> &tokens, char delim = ' ')
{
    tokens.clear();
    auto string_find_first_not = [s, delim](size_t pos = 0) -> size_t {
        for (size_t i = pos; i < s.size(); i++) {
            if (s[i] != delim)
                return i;
        }
        return string::npos;
    };
    size_t lastPos = string_find_first_not(0);
    size_t pos = s.find(delim, lastPos);
    while (lastPos != string::npos) {
        tokens.emplace_back(s.substr(lastPos, pos - lastPos));
        lastPos = string_find_first_not(pos);
        pos = s.find(delim, lastPos);
    }
}